

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcMinBase.c
# Opt level: O2

int Abc_NodeCheckDupFanin(Abc_Obj_t *pFanin,Abc_Obj_t *pFanout,int *piFanin)

{
  int iVar1;
  long lVar2;
  
  iVar1 = 0;
  for (lVar2 = 0; lVar2 < (pFanout->vFanins).nSize; lVar2 = lVar2 + 1) {
    if ((Abc_Obj_t *)pFanout->pNtk->vObjs->pArray[(pFanout->vFanins).pArray[lVar2]] == pFanin) {
      if (piFanin != (int *)0x0) {
        *piFanin = (int)lVar2;
      }
      iVar1 = iVar1 + 1;
    }
  }
  return iVar1;
}

Assistant:

int Abc_NodeCheckDupFanin( Abc_Obj_t * pFanin, Abc_Obj_t * pFanout, int * piFanin )
{
    Abc_Obj_t * pObj;
    int i, Counter = 0;
    Abc_ObjForEachFanin( pFanout, pObj, i )
        if ( pObj == pFanin )
        {
            if ( piFanin )
                *piFanin = i;
            Counter++;
        }
    return Counter;
}